

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O0

int magma_cipher_do_cbc(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  undefined8 uVar1;
  int iVar2;
  byte *out_00;
  undefined8 *puVar3;
  long in_RCX;
  undefined8 *in_RDX;
  gost_ctx *in_RSI;
  undefined8 in_RDI;
  uchar *iv;
  ossl_gost_cipher_ctx *c;
  int i;
  uchar *out_ptr;
  uchar *in_ptr;
  uchar d [8];
  uchar b [8];
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined8 *local_38;
  byte local_28 [8];
  long local_20;
  undefined8 local_8;
  
  local_20 = in_RCX;
  local_8 = in_RDI;
  out_00 = (byte *)EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  puVar3 = (undefined8 *)EVP_CIPHER_CTX_iv_noconst(local_8);
  iVar2 = EVP_CIPHER_CTX_is_encrypting(local_8);
  local_38 = in_RDX;
  if (iVar2 == 0) {
    for (; local_20 != 0; local_20 = local_20 + -8) {
      magmadecrypt(in_RSI,(byte *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                   out_00);
      uVar1 = *local_38;
      for (in_stack_ffffffffffffffbc = 0; in_stack_ffffffffffffffbc < 8;
          in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc + 1) {
        *(byte *)((long)in_RSI->master_key + (long)in_stack_ffffffffffffffbc) =
             *(byte *)((long)puVar3 + (long)in_stack_ffffffffffffffbc) ^
             local_28[in_stack_ffffffffffffffbc];
      }
      *puVar3 = uVar1;
      in_RSI = (gost_ctx *)(in_RSI->master_key + 2);
      local_38 = local_38 + 1;
    }
  }
  else {
    for (; local_20 != 0; local_20 = local_20 + -8) {
      for (iVar2 = 0; iVar2 < 8; iVar2 = iVar2 + 1) {
        *(byte *)((long)in_RSI->master_key + (long)iVar2) =
             *(byte *)((long)puVar3 + (long)iVar2) ^ *(byte *)((long)local_38 + (long)iVar2);
      }
      magmacrypt(in_RSI,(byte *)CONCAT44(iVar2,in_stack_ffffffffffffffb8),out_00);
      *puVar3 = *(undefined8 *)in_RSI->master_key;
      in_RSI = (gost_ctx *)(in_RSI->master_key + 2);
      local_38 = local_38 + 1;
    }
  }
  return 1;
}

Assistant:

static int magma_cipher_do_cbc(EVP_CIPHER_CTX *ctx, unsigned char *out,
                        const unsigned char *in, size_t inl)
{
    unsigned char b[8];
    unsigned char d[8];
    const unsigned char *in_ptr = in;
    unsigned char *out_ptr = out;
    int i;
    struct ossl_gost_cipher_ctx *c = EVP_CIPHER_CTX_get_cipher_data(ctx);
    unsigned char *iv = EVP_CIPHER_CTX_iv_noconst(ctx);
    if (EVP_CIPHER_CTX_encrypting(ctx)) {
        while (inl > 0) {

            for (i = 0; i < 8; i++) {
                out_ptr[i] = iv[i] ^ in_ptr[i];
            }
            magmacrypt(&(c->cctx), out_ptr, out_ptr);
            memcpy(iv, out_ptr, 8);
            out_ptr += 8;
            in_ptr += 8;
            inl -= 8;
        }
    } else {
        while (inl > 0) {
            magmadecrypt(&(c->cctx), in_ptr, b);
            memcpy(d, in_ptr, 8);
            for (i = 0; i < 8; i++) {
                out_ptr[i] = iv[i] ^ b[i];
            }
            memcpy(iv, d, 8);
            out_ptr += 8;
            in_ptr += 8;
            inl -= 8;
        }
    }
    return 1;
}